

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp3::sPolynomial11
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *this;
  Index in_stack_ffffffffffffff58;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *in_stack_ffffffffffffff60;
  
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x940c26);
  row = -*pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_ffffffffffffff60,(Index)row,0x940c5d);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)(row / *pSVar5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940c81);
  *pSVar5 = (Scalar)this;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940ca2);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940cc3);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940cea);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940d0b);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940d3c);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940d5d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940d7e);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940da5);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940dc6);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940df7);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940e18);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940e39);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940e60);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940e81);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940ea2);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940ec9);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940eea);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940f0b);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940f35);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940f56);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940f8d);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940fb1);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940fd5);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x941002);
  *pSVar5 = dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial11( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(11,11) = -groebnerMatrix(10,14)/(groebnerMatrix(10,13));
  groebnerMatrix(11,12) = (groebnerMatrix(8,12)/(groebnerMatrix(8,7))-groebnerMatrix(10,15)/(groebnerMatrix(10,13)));
  groebnerMatrix(11,13) = (groebnerMatrix(8,13)/(groebnerMatrix(8,7))-groebnerMatrix(10,16)/(groebnerMatrix(10,13)));
  groebnerMatrix(11,14) = groebnerMatrix(8,14)/(groebnerMatrix(8,7));
  groebnerMatrix(11,15) = groebnerMatrix(8,15)/(groebnerMatrix(8,7));
  groebnerMatrix(11,16) = (groebnerMatrix(8,16)/(groebnerMatrix(8,7))-groebnerMatrix(10,17)/(groebnerMatrix(10,13)));
  groebnerMatrix(11,17) = groebnerMatrix(8,17)/(groebnerMatrix(8,7));
}